

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipm.cc
# Opt level: O2

void __thiscall ipx::IPM::PrintOutput(IPM *this)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  Basis *this_00;
  int in_ECX;
  int prec;
  _func_int *p_Var4;
  Control *pCVar5;
  char *pcVar6;
  double dVar7;
  double dVar8;
  string local_290;
  Timer timer;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream h_logging_stream;
  undefined1 local_198 [376];
  
  bVar1 = Iterate::feasible(this->iterate_);
  if (bVar1) {
    bVar1 = Iterate::optimal(this->iterate_);
    in_ECX = 0x39a221;
    pcVar6 = " ";
    if (bVar1) {
      pcVar6 = "*";
    }
  }
  else {
    pcVar6 = " ";
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&h_logging_stream);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  local_290._M_string_length = 0;
  local_290.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringbuf::str((string *)(local_198 + 8));
  std::__cxx11::string::~string((string *)&local_290);
  poVar3 = std::operator<<((ostream *)local_198," ");
  Format_abi_cxx11_(&local_290,(ipx *)(ulong)(uint)(this->info_->super_ipx_info).iter,3,in_ECX);
  poVar3 = std::operator<<(poVar3,(string *)&local_290);
  poVar3 = std::operator<<(poVar3,pcVar6);
  poVar3 = std::operator<<(poVar3,"  ");
  dVar7 = Iterate::presidual(this->iterate_);
  Scientific_abi_cxx11_((string *)&timer,(ipx *)0x8,dVar7,2,in_ECX);
  poVar3 = std::operator<<(poVar3,(string *)&timer);
  poVar3 = std::operator<<(poVar3," ");
  dVar7 = Iterate::dresidual(this->iterate_);
  Scientific_abi_cxx11_(&local_228,(ipx *)0x8,dVar7,2,in_ECX);
  poVar3 = std::operator<<(poVar3,(string *)&local_228);
  poVar3 = std::operator<<(poVar3,"  ");
  dVar7 = Iterate::pobjective_after_postproc(this->iterate_);
  Scientific_abi_cxx11_(&local_248,(ipx *)0xf,dVar7,8,in_ECX);
  poVar3 = std::operator<<(poVar3,(string *)&local_248);
  poVar3 = std::operator<<(poVar3," ");
  dVar7 = Iterate::dobjective_after_postproc(this->iterate_);
  Scientific_abi_cxx11_(&local_1c8,(ipx *)0xf,dVar7,8,in_ECX);
  poVar3 = std::operator<<(poVar3,(string *)&local_1c8);
  poVar3 = std::operator<<(poVar3,"  ");
  dVar7 = Iterate::mu(this->iterate_);
  Scientific_abi_cxx11_(&local_1e8,(ipx *)0x8,dVar7,2,in_ECX);
  std::operator<<(poVar3,(string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&timer);
  std::__cxx11::string::~string((string *)&local_290);
  pCVar5 = this->control_;
  if ((pCVar5->parameters_).super_ipx_parameters.timeless_log == false) {
    poVar3 = std::operator<<((ostream *)local_198,"  ");
    dVar7 = Control::Elapsed(this->control_);
    Fixed_abi_cxx11_(&local_290,(ipx *)0x6,dVar7,0,in_ECX);
    poVar3 = std::operator<<(poVar3,(string *)&local_290);
    std::operator<<(poVar3,"s");
    std::__cxx11::string::~string((string *)&local_290);
    pCVar5 = this->control_;
  }
  Control::hLog(pCVar5,&h_logging_stream);
  poVar3 = Control::Debug(this->control_,1);
  poVar3 = std::operator<<(poVar3,"  ");
  Fixed_abi_cxx11_(&local_290,(ipx *)0x4,this->step_primal_,2,in_ECX);
  poVar3 = std::operator<<(poVar3,(string *)&local_290);
  poVar3 = std::operator<<(poVar3," ");
  Fixed_abi_cxx11_((string *)&timer,(ipx *)0x4,this->step_dual_,2,in_ECX);
  poVar3 = std::operator<<(poVar3,(string *)&timer);
  poVar3 = std::operator<<(poVar3,"  ");
  uVar2 = KKTSolver::basis_changes(this->kkt_);
  Format_abi_cxx11_(&local_228,(ipx *)(ulong)uVar2,7,in_ECX);
  poVar3 = std::operator<<(poVar3,(string *)&local_228);
  poVar3 = std::operator<<(poVar3," ");
  uVar2 = KKTSolver::iter(this->kkt_);
  Format_abi_cxx11_(&local_248,(ipx *)(ulong)uVar2,7,in_ECX);
  std::operator<<(poVar3,(string *)&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&timer);
  std::__cxx11::string::~string((string *)&local_290);
  poVar3 = Control::Debug(this->control_,1);
  poVar3 = std::operator<<(poVar3,"  ");
  Format_abi_cxx11_(&local_290,(ipx *)(ulong)(uint)(this->info_->super_ipx_info).dual_dropped,7,
                    in_ECX);
  poVar3 = std::operator<<(poVar3,(string *)&local_290);
  poVar3 = std::operator<<(poVar3," ");
  Format_abi_cxx11_((string *)&timer,
                    (ipx *)(ulong)(uint)(this->info_->super_ipx_info).primal_dropped,7,in_ECX);
  std::operator<<(poVar3,(string *)&timer);
  std::__cxx11::string::~string((string *)&timer);
  std::__cxx11::string::~string((string *)&local_290);
  this_00 = KKTSolver::basis(this->kkt_);
  if (this_00 == (Basis *)0x0) {
    poVar3 = Control::Debug(this->control_,4);
    poVar3 = std::operator<<(poVar3,"  ");
    Format_abi_cxx11_(&local_290,(ipx *)0x3a5ffe,(char *)0x9,in_ECX);
    std::operator<<(poVar3,(string *)&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    poVar3 = Control::Debug(this->control_,4);
    poVar3 = std::operator<<(poVar3,"  ");
    Format_abi_cxx11_(&local_290,(ipx *)0x3a5ffe,(char *)0x8,in_ECX);
    std::operator<<(poVar3,(string *)&local_290);
  }
  else {
    poVar3 = Control::Debug(this->control_,4);
    p_Var4 = poVar3->_vptr_basic_ostream[-3];
    if (((&poVar3->field_0x20)[(long)p_Var4] & 5) != 0) goto LAB_0037cb88;
    poVar3 = Control::Debug(this->control_,4);
    prec = (int)p_Var4;
    poVar3 = std::operator<<(poVar3,"  ");
    dVar7 = Basis::MinSingularValue(this_00);
    Scientific_abi_cxx11_(&local_290,(ipx *)0x9,dVar7,2,prec);
    std::operator<<(poVar3,(string *)&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    Timer::Timer(&timer);
    dVar7 = Basis::DensityInverse(this_00);
    dVar8 = Timer::Elapsed(&timer);
    (this->info_->super_ipx_info).time_symb_invert =
         dVar8 + (this->info_->super_ipx_info).time_symb_invert;
    poVar3 = Control::Debug(this->control_,4);
    poVar3 = std::operator<<(poVar3,"  ");
    Scientific_abi_cxx11_(&local_290,(ipx *)0x8,dVar7,2,prec);
    std::operator<<(poVar3,(string *)&local_290);
  }
  std::__cxx11::string::~string((string *)&local_290);
LAB_0037cb88:
  pCVar5 = this->control_;
  std::__cxx11::string::string((string *)&local_208,"\n",(allocator *)&local_290);
  Control::hLog(pCVar5,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::stringstream::~stringstream((stringstream *)&h_logging_stream);
  return;
}

Assistant:

void IPM::PrintOutput() {
    const bool ipm_optimal = iterate_->feasible() && iterate_->optimal();

    if (kTerminationLogging) PrintHeader();
    std::stringstream h_logging_stream;
    h_logging_stream.str(std::string());
    h_logging_stream
      << " "  << Format(info_->iter, 3)
      << (ipm_optimal ? "*" : " ")
      << "  " << Scientific(iterate_->presidual(), 8, 2)
      << " "  << Scientific(iterate_->dresidual(), 8, 2)
      << "  " << Scientific(iterate_->pobjective_after_postproc(), 15, 8)
      << " "  << Scientific(iterate_->dobjective_after_postproc(), 15, 8)
      << "  " << Scientific(iterate_->mu(), 8, 2);
    if (!control_.timelessLog())
      h_logging_stream << "  " << Fixed(control_.Elapsed(), 6, 0) << "s";
    control_.hLog(h_logging_stream);
    control_.Debug()
      << "  " << Fixed(step_primal_, 4, 2) << " " << Fixed(step_dual_, 4, 2)
      << "  " << Format(kkt_->basis_changes(), 7)
      << " "  << Format(kkt_->iter(), 7);
    control_.Debug()
      << "  " << Format(info_->dual_dropped, 7)
      << " "  << Format(info_->primal_dropped, 7);

    const Basis* basis = kkt_->basis();
    if (basis) {
        if (control_.Debug(4)) {
            control_.Debug(4) << "  "
                              << Scientific(basis->MinSingularValue(), 9, 2);
            Timer timer;
            double density = basis->DensityInverse();
            info_->time_symb_invert += timer.Elapsed();
            control_.Debug(4) << "  " << Scientific(density, 8, 2);
        }
    } else {
        control_.Debug(4) << "  " << Format("-", 9);
        control_.Debug(4) << "  " << Format("-", 8);
    }
    control_.hLog("\n");
}